

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

void __thiscall
rr::TriangleRasterizer::rasterizeSingleSample
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  float fVar1;
  float fVar2;
  deInt32 v;
  deInt32 v_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  int *piVar7;
  deInt64 dVar8;
  deInt64 dVar9;
  deInt64 dVar10;
  long *plVar11;
  deUint64 dVar12;
  FragmentPacket *pFVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  bool local_2f9;
  bool local_2d1;
  bool local_2a9;
  bool local_281;
  Vector<float,_4> local_240;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  Vector<int,_2> local_200;
  Vector<float,_4> local_1f8;
  undefined1 local_1e8 [8];
  Vec4 bSum;
  Vec4 b2;
  Vec4 b1;
  Vec4 b0;
  FragmentPacket *packet;
  Vec4 z1;
  Vec4 z0;
  undefined1 local_16c [8];
  Vec4 edgeSum;
  Vec4 e20f;
  Vec4 e12f;
  Vec4 e01f;
  int i;
  deUint64 coverage;
  Vector<long,_4> e20;
  Vector<long,_4> e12;
  Vector<long,_4> e01;
  bool outY1;
  bool outX1;
  deInt64 sy [4];
  deInt64 sx [4];
  deInt64 sy1;
  deInt64 sy0;
  deInt64 sx1;
  deInt64 sx0;
  int y0;
  int x0;
  float zc;
  float zb;
  float za;
  int packetNdx;
  deUint64 halfPixel;
  int *numPacketsRasterized_local;
  int maxFragmentPackets_local;
  float *depthValues_local;
  FragmentPacket *fragmentPackets_local;
  TriangleRasterizer *this_local;
  
  zb = 0.0;
  pfVar6 = tcu::Vector<float,_4>::z(&this->m_v0);
  fVar16 = *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::z(&this->m_v2);
  fVar16 = fVar16 - *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::z(&this->m_v1);
  fVar17 = *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::z(&this->m_v2);
  fVar17 = fVar17 - *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::z(&this->m_v2);
  fVar1 = *pfVar6;
  while( true ) {
    piVar7 = tcu::Vector<int,_2>::y(&this->m_curPos);
    iVar4 = *piVar7;
    piVar7 = tcu::Vector<int,_2>::y(&this->m_bboxMax);
    if (*piVar7 < iVar4 || maxFragmentPackets <= (int)zb) break;
    piVar7 = tcu::Vector<int,_2>::x(&this->m_curPos);
    v = *piVar7;
    piVar7 = tcu::Vector<int,_2>::y(&this->m_curPos);
    v_00 = *piVar7;
    dVar8 = toSubpixelCoord(v);
    toSubpixelCoord(v + 1);
    dVar9 = toSubpixelCoord(v_00);
    dVar10 = toSubpixelCoord(v_00 + 1);
    sy[1] = dVar10 + 0x80;
    sy[0] = dVar9 + 0x80;
    sy[2] = sy[1];
    sy[3] = dVar8 + 0x80;
    iVar4 = tcu::Vector<int,_4>::x(&this->m_viewport);
    iVar5 = tcu::Vector<int,_4>::z(&this->m_viewport);
    bVar14 = v + 1 != iVar4 + iVar5;
    iVar4 = tcu::Vector<int,_4>::y(&this->m_viewport);
    iVar5 = tcu::Vector<int,_4>::w(&this->m_viewport);
    bVar15 = v_00 + 1 != iVar4 + iVar5;
    tcu::Vector<long,_4>::Vector((Vector<long,_4> *)(e12.m_data + 3));
    tcu::Vector<long,_4>::Vector((Vector<long,_4> *)(e20.m_data + 3));
    tcu::Vector<long,_4>::Vector((Vector<long,_4> *)&coverage);
    for (e01f.m_data[2] = 0.0; (int)e01f.m_data[2] < 4;
        e01f.m_data[2] = (float)((int)e01f.m_data[2] + 1)) {
      dVar8 = evaluateEdge(&this->m_edge01,sy[(long)(int)e01f.m_data[2] + 3],
                           sy[(long)(int)e01f.m_data[2] + -1]);
      plVar11 = tcu::Vector<long,_4>::operator[]
                          ((Vector<long,_4> *)(e12.m_data + 3),(int)e01f.m_data[2]);
      *plVar11 = dVar8;
      dVar8 = evaluateEdge(&this->m_edge12,sy[(long)(int)e01f.m_data[2] + 3],
                           sy[(long)(int)e01f.m_data[2] + -1]);
      plVar11 = tcu::Vector<long,_4>::operator[]
                          ((Vector<long,_4> *)(e20.m_data + 3),(int)e01f.m_data[2]);
      *plVar11 = dVar8;
      dVar8 = evaluateEdge(&this->m_edge20,sy[(long)(int)e01f.m_data[2] + 3],
                           sy[(long)(int)e01f.m_data[2] + -1]);
      plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)&coverage,(int)e01f.m_data[2]);
      *plVar11 = dVar8;
    }
    plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)(e12.m_data + 3),0);
    bVar3 = isInsideCCW(&this->m_edge01,*plVar11);
    local_281 = false;
    if (bVar3) {
      plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)(e20.m_data + 3),0);
      bVar3 = isInsideCCW(&this->m_edge12,*plVar11);
      local_281 = false;
      if (bVar3) {
        plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)&coverage,0);
        local_281 = isInsideCCW(&this->m_edge20,*plVar11);
      }
    }
    dVar12 = setCoverageValue(0,1,0,0,0,local_281);
    local_2a9 = false;
    if (bVar14) {
      plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)(e12.m_data + 3),1);
      bVar3 = isInsideCCW(&this->m_edge01,*plVar11);
      local_2a9 = false;
      if (bVar3) {
        plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)(e20.m_data + 3),1);
        bVar3 = isInsideCCW(&this->m_edge12,*plVar11);
        local_2a9 = false;
        if (bVar3) {
          plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)&coverage,1);
          local_2a9 = isInsideCCW(&this->m_edge20,*plVar11);
        }
      }
    }
    dVar12 = setCoverageValue(dVar12,1,1,0,0,local_2a9);
    local_2d1 = false;
    if (bVar15) {
      plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)(e12.m_data + 3),2);
      bVar3 = isInsideCCW(&this->m_edge01,*plVar11);
      local_2d1 = false;
      if (bVar3) {
        plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)(e20.m_data + 3),2);
        bVar3 = isInsideCCW(&this->m_edge12,*plVar11);
        local_2d1 = false;
        if (bVar3) {
          plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)&coverage,2);
          local_2d1 = isInsideCCW(&this->m_edge20,*plVar11);
        }
      }
    }
    dVar12 = setCoverageValue(dVar12,1,0,1,0,local_2d1);
    local_2f9 = false;
    if ((bVar14) && (local_2f9 = false, bVar15)) {
      plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)(e12.m_data + 3),3);
      bVar14 = isInsideCCW(&this->m_edge01,*plVar11);
      local_2f9 = false;
      if (bVar14) {
        plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)(e20.m_data + 3),3);
        bVar14 = isInsideCCW(&this->m_edge12,*plVar11);
        local_2f9 = false;
        if (bVar14) {
          plVar11 = tcu::Vector<long,_4>::operator[]((Vector<long,_4> *)&coverage,3);
          local_2f9 = isInsideCCW(&this->m_edge20,*plVar11);
        }
      }
    }
    dVar12 = setCoverageValue(dVar12,1,1,1,0,local_2f9);
    piVar7 = tcu::Vector<int,_2>::x(&this->m_curPos);
    *piVar7 = *piVar7 + 2;
    piVar7 = tcu::Vector<int,_2>::x(&this->m_curPos);
    iVar4 = *piVar7;
    piVar7 = tcu::Vector<int,_2>::x(&this->m_bboxMax);
    if (*piVar7 < iVar4) {
      piVar7 = tcu::Vector<int,_2>::y(&this->m_curPos);
      *piVar7 = *piVar7 + 2;
      piVar7 = tcu::Vector<int,_2>::x(&this->m_bboxMin);
      iVar4 = *piVar7;
      piVar7 = tcu::Vector<int,_2>::x(&this->m_curPos);
      *piVar7 = iVar4;
    }
    if (dVar12 != 0) {
      tcu::Vector<long,_4>::asFloat((Vector<long,_4> *)(e12f.m_data + 2));
      tcu::Vector<long,_4>::asFloat((Vector<long,_4> *)(e20f.m_data + 2));
      tcu::Vector<long,_4>::asFloat((Vector<long,_4> *)(edgeSum.m_data + 2));
      if (depthValues != (float *)0x0) {
        tcu::operator+((tcu *)(z0.m_data + 2),(Vector<float,_4> *)(e12f.m_data + 2),
                       (Vector<float,_4> *)(e20f.m_data + 2));
        tcu::operator+((tcu *)local_16c,(Vector<float,_4> *)(z0.m_data + 2),
                       (Vector<float,_4> *)(edgeSum.m_data + 2));
        tcu::operator/((tcu *)(z1.m_data + 2),(Vector<float,_4> *)(e20f.m_data + 2),
                       (Vector<float,_4> *)local_16c);
        tcu::operator/((tcu *)((long)&packet + 4),(Vector<float,_4> *)(edgeSum.m_data + 2),
                       (Vector<float,_4> *)local_16c);
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(z1.m_data + 2),0);
        fVar2 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)((long)&packet + 4),0);
        depthValues[(int)zb << 2] = fVar2 * fVar16 + *pfVar6 * fVar17 + fVar1;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(z1.m_data + 2),1);
        fVar2 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)((long)&packet + 4),1);
        depthValues[(int)zb * 4 + 1] = fVar2 * fVar16 + *pfVar6 * fVar17 + fVar1;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(z1.m_data + 2),2);
        fVar2 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)((long)&packet + 4),2);
        depthValues[(int)zb * 4 + 2] = fVar2 * fVar16 + *pfVar6 * fVar17 + fVar1;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(z1.m_data + 2),3);
        fVar2 = *pfVar6;
        pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)((long)&packet + 4),3);
        depthValues[(int)zb * 4 + 3] = fVar2 * fVar16 + *pfVar6 * fVar17 + fVar1;
      }
      pFVar13 = fragmentPackets + (int)zb;
      pfVar6 = tcu::Vector<float,_4>::w(&this->m_v0);
      tcu::operator*((tcu *)(b1.m_data + 2),(Vector<float,_4> *)(e20f.m_data + 2),*pfVar6);
      pfVar6 = tcu::Vector<float,_4>::w(&this->m_v1);
      tcu::operator*((tcu *)(b2.m_data + 2),(Vector<float,_4> *)(edgeSum.m_data + 2),*pfVar6);
      pfVar6 = tcu::Vector<float,_4>::w(&this->m_v2);
      tcu::operator*((tcu *)(bSum.m_data + 2),(Vector<float,_4> *)(e12f.m_data + 2),*pfVar6);
      tcu::operator+((tcu *)&local_1f8,(Vector<float,_4> *)(b1.m_data + 2),
                     (Vector<float,_4> *)(b2.m_data + 2));
      tcu::operator+((tcu *)local_1e8,&local_1f8,(Vector<float,_4> *)(bSum.m_data + 2));
      tcu::Vector<int,_2>::Vector(&local_200,v,v_00);
      *&(pFVar13->position).m_data = local_200.m_data;
      pFVar13->coverage = dVar12;
      tcu::operator/((tcu *)&local_210,(Vector<float,_4> *)(b1.m_data + 2),
                     (Vector<float,_4> *)local_1e8);
      *(undefined8 *)pFVar13->barycentric[0].m_data = local_210;
      *(undefined8 *)(pFVar13->barycentric[0].m_data + 2) = local_208;
      tcu::operator/((tcu *)&local_220,(Vector<float,_4> *)(b2.m_data + 2),
                     (Vector<float,_4> *)local_1e8);
      *(undefined8 *)pFVar13->barycentric[1].m_data = local_220;
      *(undefined8 *)(pFVar13->barycentric[1].m_data + 2) = local_218;
      tcu::operator-((tcu *)&local_240,1.0,pFVar13->barycentric);
      tcu::operator-((tcu *)&local_230,&local_240,pFVar13->barycentric + 1);
      *(undefined8 *)pFVar13->barycentric[2].m_data = local_230;
      *(undefined8 *)(pFVar13->barycentric[2].m_data + 2) = local_228;
      zb = (float)((int)zb + 1);
    }
  }
  *numPacketsRasterized = (int)zb;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeSingleSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation; given barycentrics A, B, C = (1 - A - B)
	// we can reformulate the usual z = z0*A + z1*B + z2*C into more
	// stable equation z = A*(z0 - z2) + B*(z1 - z2) + z2.
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0)	+ halfPixel;
		const deInt64	sx1		= toSubpixelCoord(x0+1)	+ halfPixel;
		const deInt64	sy0		= toSubpixelCoord(y0)	+ halfPixel;
		const deInt64	sy1		= toSubpixelCoord(y0+1)	+ halfPixel;

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01;
		tcu::Vector<deInt64, 4>	e12;
		tcu::Vector<deInt64, 4>	e20;

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values
		for (int i = 0; i < 4; i++)
		{
			e01[i] = evaluateEdge(m_edge01, sx[i], sy[i]);
			e12[i] = evaluateEdge(m_edge12, sx[i], sy[i]);
			e20[i] = evaluateEdge(m_edge20, sx[i], sy[i]);
		}

		// Compute coverage mask
		coverage = setCoverageValue(coverage, 1, 0, 0, 0,						isInsideCCW(m_edge01, e01[0]) && isInsideCCW(m_edge12, e12[0]) && isInsideCCW(m_edge20, e20[0]));
		coverage = setCoverageValue(coverage, 1, 1, 0, 0, !outX1 &&				isInsideCCW(m_edge01, e01[1]) && isInsideCCW(m_edge12, e12[1]) && isInsideCCW(m_edge20, e20[1]));
		coverage = setCoverageValue(coverage, 1, 0, 1, 0, !outY1 &&				isInsideCCW(m_edge01, e01[2]) && isInsideCCW(m_edge12, e12[2]) && isInsideCCW(m_edge20, e20[2]));
		coverage = setCoverageValue(coverage, 1, 1, 1, 0, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[3]) && isInsideCCW(m_edge12, e12[3]) && isInsideCCW(m_edge20, e20[3]));

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Floating-point edge values for barycentrics etc.
		const tcu::Vec4		e01f	= e01.asFloat();
		const tcu::Vec4		e12f	= e12.asFloat();
		const tcu::Vec4		e20f	= e20.asFloat();

		// Compute depth values.
		if (depthValues)
		{
			const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
			const tcu::Vec4		z0		= e12f / edgeSum;
			const tcu::Vec4		z1		= e20f / edgeSum;

			depthValues[packetNdx*4+0] = z0[0]*za + z1[0]*zb + zc;
			depthValues[packetNdx*4+1] = z0[1]*za + z1[1]*zb + zc;
			depthValues[packetNdx*4+2] = z0[2]*za + z1[2]*zb + zc;
			depthValues[packetNdx*4+3] = z0[3]*za + z1[3]*zb + zc;
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}